

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceShape.cpp
# Opt level: O3

void __thiscall chrono::ChSurfaceShape::ArchiveIN(ChSurfaceShape *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::geometry::ChSurface>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChSurfaceShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_38._value = &this->gsurface;
  local_38._name = "gsurface";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::geometry::ChSurface>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::geometry::ChSurface> *)&this->wireframe;
  local_38._name = "wireframe";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::geometry::ChSurface> *)&this->resolution_U;
  local_38._name = "resolution_U";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::geometry::ChSurface> *)&this->resolution_V;
  local_38._name = "resolution_V";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  return;
}

Assistant:

void ChSurfaceShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSurfaceShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gsurface);
    marchive >> CHNVP(wireframe);
    marchive >> CHNVP(resolution_U);
    marchive >> CHNVP(resolution_V);
}